

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O2

void __thiscall
cfg::tag_vector_t<cfgfile::string_trait_t>::tag_vector_t
          (tag_vector_t<cfgfile::string_trait_t> *this)

{
  allocator local_51;
  string local_50 [32];
  string_t local_30;
  
  std::__cxx11::string::string(local_50,"vector",&local_51);
  std::__cxx11::string::string((string *)&local_30,local_50);
  cfgfile::tag_no_value_t<cfgfile::string_trait_t>::tag_no_value_t
            (&this->super_tag_no_value_t<cfgfile::string_trait_t>,&local_30,true);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string(local_50);
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_vector_t_00138608;
  std::__cxx11::string::string(local_50,"vector",&local_51);
  std::__cxx11::string::string((string *)&local_30,local_50);
  cfgfile::tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>::
  tag_vector_of_tags_t(&this->m_vector,(tag_t<cfgfile::string_trait_t> *)this,&local_30,true);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

tag_vector_t()
		:	cfgfile::tag_no_value_t< Trait >( Trait::from_ascii( "vector" ), true )
		,	m_vector( *this, Trait::from_ascii( "vector" ), true )
	{
	}